

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlmder_.c
# Opt level: O1

int main(void)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  int iVar4;
  long lVar5;
  double dVar6;
  int n;
  int ldfjac;
  int one;
  int m;
  double local_3b0;
  int njev;
  int mode;
  int maxfev;
  double ftol;
  ulong local_390;
  double gtol;
  double xtol;
  int nfev;
  int info;
  int nprint;
  double local_368 [3];
  int ipvt [3];
  double factor;
  double wa1 [3];
  double wa3 [3];
  double wa2 [3];
  double qtf [3];
  double diag [3];
  double wa4 [15];
  double fjac [45];
  double fvec [15];
  
  one = 1;
  m = 0xf;
  n = 3;
  local_368[0] = 1.0;
  local_368[1] = 1.0;
  local_368[2] = 1.0;
  ldfjac = 0xf;
  dVar6 = dpmpar_(&one);
  if (dVar6 < 0.0) {
    ftol = sqrt(dVar6);
  }
  else {
    ftol = SQRT(dVar6);
  }
  dVar6 = dpmpar_(&one);
  if (dVar6 < 0.0) {
    xtol = sqrt(dVar6);
  }
  else {
    xtol = SQRT(dVar6);
  }
  gtol = 0.0;
  maxfev = 400;
  mode = 1;
  factor = 100.0;
  nprint = 0;
  lmder_(fcn,&m,&n,local_368,fvec,fjac,&ldfjac,&ftol,&xtol,&gtol,&maxfev,diag,&mode,&factor,&nprint,
         &info,&nfev,&njev,ipvt,qtf,wa1,wa2,wa3,wa4);
  local_3b0 = enorm_(&m,fvec);
  printf("      final l2 norm of the residuals%15.7g\n\n");
  printf("      number of function evaluations%10i\n\n",(ulong)(uint)nfev);
  printf("      number of Jacobian evaluations%10i\n\n",(ulong)(uint)njev);
  printf("      exit parameter                %10i\n\n",(ulong)(uint)info);
  puts("      final approximate solution");
  if (0 < n) {
    uVar2 = 1;
    lVar5 = 0;
    do {
      pcVar3 = "\n     ";
      if ((int)lVar5 != (int)(uVar2 / 3) * 3) {
        pcVar3 = "";
      }
      printf("%s%15.7g",SUB84(local_368[lVar5],0),pcVar3);
      lVar5 = lVar5 + 1;
      uVar2 = (ulong)((int)uVar2 + 1);
    } while (lVar5 < n);
  }
  putchar(10);
  ftol = dpmpar_(&one);
  iVar1 = m - n;
  covar_(&n,fjac,&ldfjac,ipvt,&ftol,wa1);
  puts("      covariance");
  if (0 < n) {
    dVar6 = (local_3b0 * local_3b0) / (double)iVar1;
    uVar2 = 1;
    iVar1 = 0;
    local_3b0 = dVar6;
    do {
      local_390 = uVar2;
      if (0 < n) {
        uVar2 = 1;
        iVar4 = 0;
        do {
          pcVar3 = "";
          if ((int)(uVar2 / 3) * 3 == iVar4) {
            pcVar3 = "\n     ";
          }
          printf("%s%15.7g",SUB84(fjac[ldfjac * iVar1 + iVar4] * dVar6,0),pcVar3);
          uVar2 = (ulong)((int)uVar2 + 1);
          iVar4 = iVar4 + 1;
          dVar6 = local_3b0;
        } while (iVar4 < n);
      }
      uVar2 = (ulong)((int)local_390 + 1);
      iVar1 = iVar1 + 1;
    } while ((int)local_390 < n);
  }
  putchar(10);
  return 0;
}

Assistant:

int main()
{
  int i, j, m, n, ldfjac, maxfev, mode, nprint, info, nfev, njev;
  int ipvt[3];
  real ftol, xtol, gtol, factor, fnorm;
  real x[3], fvec[15], fjac[15*3], diag[3], qtf[3], 
    wa1[3], wa2[3], wa3[3], wa4[15];
  int one=1;
  real covfac;

  m = 15;
  n = 3;

/*      the following starting values provide a rough fit. */

  x[1-1] = 1.;
  x[2-1] = 1.;
  x[3-1] = 1.;

  ldfjac = 15;

  /*      set ftol and xtol to the square root of the machine */
  /*      and gtol to zero. unless high solutions are */
  /*      required, these are the recommended settings. */

  ftol = sqrt(__minpack_func__(dpmpar)(&one));
  xtol = sqrt(__minpack_func__(dpmpar)(&one));
  gtol = 0.;
    
  maxfev = 400;
  mode = 1;
  factor = 1.e2;
  nprint = 0;

  __minpack_func__(lmder)(&fcn, &m, &n, x, fvec, fjac, &ldfjac, &ftol, &xtol, &gtol, 
	&maxfev, diag, &mode, &factor, &nprint, &info, &nfev, &njev, 
	ipvt, qtf, wa1, wa2, wa3, wa4);
  fnorm = __minpack_func__(enorm)(&m, fvec);
  printf("      final l2 norm of the residuals%15.7g\n\n", (double)fnorm);
  printf("      number of function evaluations%10i\n\n", nfev);
  printf("      number of Jacobian evaluations%10i\n\n", njev);
  printf("      exit parameter                %10i\n\n", info);
  printf("      final approximate solution\n");
  for (j=1; j<=n; j++) {
    printf("%s%15.7g", j%3==1?"\n     ":"", (double)x[j-1]);
  }
  printf("\n");
  ftol = __minpack_func__(dpmpar)(&one);
  covfac = fnorm*fnorm/(m-n);
  __minpack_func__(covar)(&n, fjac, &ldfjac, ipvt, &ftol, wa1);
  printf("      covariance\n");
  for (i=1; i<=n; i++) {
    for (j=1; j<=n; j++) {
      printf("%s%15.7g", j%3==1?"\n     ":"", (double)(fjac[(i-1)*ldfjac+j-1]*covfac));
    }
  }
  printf("\n");
  return 0;
}